

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftstroke.c
# Opt level: O0

void ft_stroke_border_close(FT_StrokeBorder border,FT_Bool reverse)

{
  FT_Byte FVar1;
  uint uVar2;
  uint uVar3;
  FT_Vector *pFVar4;
  FT_Vector *pFVar5;
  FT_Pos FVar6;
  FT_Pos FVar7;
  uint uVar8;
  FT_Byte *pFStack_50;
  FT_Byte tmp_1;
  FT_Byte *tag2;
  FT_Byte *tag1;
  FT_Vector tmp;
  FT_Vector *vec2;
  FT_Vector *vec1;
  FT_UInt count;
  FT_UInt start;
  FT_Bool reverse_local;
  FT_StrokeBorder border_local;
  
  uVar2 = border->start;
  uVar3 = border->num_points;
  if (uVar2 + 1 < uVar3) {
    uVar8 = uVar3 - 1;
    border->num_points = uVar8;
    pFVar4 = border->points;
    pFVar5 = border->points;
    pFVar4[uVar2].x = pFVar5[uVar8].x;
    pFVar4[uVar2].y = pFVar5[uVar8].y;
    if (reverse != '\0') {
      pFVar4 = border->points + uVar8;
      pFVar5 = border->points + uVar2;
      while( true ) {
        vec2 = pFVar5 + 1;
        tmp.y = (FT_Pos)(pFVar4 + -1);
        if ((ulong)tmp.y <= vec2) break;
        FVar6 = vec2->x;
        FVar7 = pFVar5[1].y;
        vec2->x = *(FT_Pos *)tmp.y;
        pFVar5[1].y = pFVar4[-1].y;
        *(FT_Pos *)tmp.y = FVar6;
        pFVar4[-1].y = FVar7;
        pFVar4 = (FT_Vector *)tmp.y;
        pFVar5 = vec2;
      }
      tag2 = border->tags + uVar2;
      pFStack_50 = border->tags + uVar8;
      while( true ) {
        tag2 = tag2 + 1;
        pFStack_50 = pFStack_50 + -1;
        if (pFStack_50 <= tag2) break;
        FVar1 = *tag2;
        *tag2 = *pFStack_50;
        *pFStack_50 = FVar1;
      }
    }
    border->tags[uVar2] = border->tags[uVar2] | 4;
    border->tags[uVar3 - 2] = border->tags[uVar3 - 2] | 8;
  }
  else {
    border->num_points = uVar2;
  }
  border->start = -1;
  border->movable = '\0';
  return;
}

Assistant:

static void
  ft_stroke_border_close( FT_StrokeBorder  border,
                          FT_Bool          reverse )
  {
    FT_UInt  start = (FT_UInt)border->start;
    FT_UInt  count = border->num_points;


    FT_ASSERT( border->start >= 0 );

    /* don't record empty paths! */
    if ( count <= start + 1U )
      border->num_points = start;
    else
    {
      /* copy the last point to the start of this sub-path, since */
      /* it contains the `adjusted' starting coordinates          */
      border->num_points    = --count;
      border->points[start] = border->points[count];

      if ( reverse )
      {
        /* reverse the points */
        {
          FT_Vector*  vec1 = border->points + start + 1;
          FT_Vector*  vec2 = border->points + count - 1;


          for ( ; vec1 < vec2; vec1++, vec2-- )
          {
            FT_Vector  tmp;


            tmp   = *vec1;
            *vec1 = *vec2;
            *vec2 = tmp;
          }
        }

        /* then the tags */
        {
          FT_Byte*  tag1 = border->tags + start + 1;
          FT_Byte*  tag2 = border->tags + count - 1;


          for ( ; tag1 < tag2; tag1++, tag2-- )
          {
            FT_Byte  tmp;


            tmp   = *tag1;
            *tag1 = *tag2;
            *tag2 = tmp;
          }
        }
      }

      border->tags[start    ] |= FT_STROKE_TAG_BEGIN;
      border->tags[count - 1] |= FT_STROKE_TAG_END;
    }

    border->start   = -1;
    border->movable = FALSE;
  }